

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  Ivy_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *vFrontier;
  void **ppvVar2;
  Ivy_Obj_t *vSuper;
  ulong *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x9f6,"void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
                 );
  }
  if (((pOld == (Ivy_Obj_t *)0x0) || (pOld->pNextFan1 != (Ivy_Obj_t *)0x0)) &&
     ((pNew == (Ivy_Obj_t *)0x0 || (pNew->pNextFan1 != (Ivy_Obj_t *)0x0)))) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vFrontier->pArray = ppvVar2;
  if (pOld != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Ivy_Obj_t *)0x0) {
    Ivy_FraigObjAddToFrontier(p,pNew,vFrontier);
  }
  if (0 < vFrontier->nSize) {
    lVar9 = 0;
    do {
      pNode = (Ivy_Obj_t *)vFrontier->pArray[lVar9];
      if (*(int *)&pNode->pNextFan0 == 0) {
        __assert_fail("Ivy_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa02,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      if (pNode->pNextFan1 != (Ivy_Obj_t *)0x0) {
        __assert_fail("Ivy_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa03,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      iVar1 = Ivy_ObjIsMuxType(pNode);
      if (iVar1 == 0) {
        vSuper = (Ivy_Obj_t *)Ivy_FraigCollectSuper(pNode,1);
        if (0 < vSuper->TravId) {
          lVar7 = 0;
          do {
            Ivy_FraigObjAddToFrontier
                      (p,(Ivy_Obj_t *)
                         (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) & 0xfffffffffffffffe),
                       vFrontier);
            lVar7 = lVar7 + 1;
          } while (lVar7 < vSuper->TravId);
        }
        Ivy_FraigAddClausesSuper(p,pNode,(Vec_Ptr_t *)vSuper);
      }
      else {
        vSuper = (Ivy_Obj_t *)malloc(0x10);
        vSuper->Id = 8;
        puVar3 = (ulong *)malloc(0x40);
        *(ulong **)&vSuper->field_0x8 = puVar3;
        uVar6 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) & 0xfffffffffffffffe
        ;
        vSuper->TravId = 1;
        *puVar3 = uVar6;
        uVar5 = *(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) & 0xfffffffffffffffe
        ;
        if (uVar6 == uVar5) {
          uVar4 = 1;
        }
        else {
          vSuper->TravId = 2;
          puVar3[1] = uVar5;
          uVar4 = 2;
        }
        uVar5 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x18) & 0xfffffffffffffffe
        ;
        uVar6 = (ulong)uVar4;
        uVar8 = 0;
        do {
          if (puVar3[uVar8] == uVar5) goto LAB_007e1ed5;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        uVar4 = uVar4 + 1;
        vSuper->TravId = uVar4;
        puVar3[uVar6] = uVar5;
LAB_007e1ed5:
        uVar5 = *(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x18) & 0xfffffffffffffffe
        ;
        uVar6 = 0;
        do {
          if (puVar3[uVar6] == uVar5) goto LAB_007e1f03;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        vSuper->TravId = uVar4 + 1;
        puVar3[uVar4] = uVar5;
LAB_007e1f03:
        lVar7 = 0;
        do {
          Ivy_FraigObjAddToFrontier
                    (p,(Ivy_Obj_t *)
                       (*(ulong *)(*(long *)&vSuper->field_0x8 + lVar7 * 8) & 0xfffffffffffffffe),
                     vFrontier);
          lVar7 = lVar7 + 1;
        } while (lVar7 < vSuper->TravId);
        Ivy_FraigAddClausesMux(p,pNode);
      }
      if (vSuper->TravId < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0xa16,
                      "void Ivy_FraigNodeAddToSolver(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      pNode->pNextFan1 = vSuper;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
  }
  free(vFrontier);
  sat_solver_simplify(p->pSat);
  return;
}

Assistant:

void Ivy_FraigNodeAddToSolver( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Ivy_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Ivy_ObjFaninVec(pOld)) && (!pNew || Ivy_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Ivy_FraigObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Ivy_FraigObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ivy_ObjSatNum(pNode) );
        assert( Ivy_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Ivy_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin0( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Ivy_ObjFanin1( Ivy_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Ivy_FraigCollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, k )
                Ivy_FraigObjAddToFrontier( p, Ivy_Regular(pFanin), vFrontier );
            Ivy_FraigAddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Ivy_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
    sat_solver_simplify( p->pSat );
}